

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImpl.cpp
# Opt level: O1

void __thiscall sf::priv::WindowImpl::processSensorEvents(WindowImpl *this)

{
  iterator *piVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  _Elt_pointer pEVar6;
  bool bVar7;
  SensorManager *pSVar8;
  float *pfVar9;
  Type sensor;
  Type sensor_00;
  long lVar10;
  float fVar11;
  Vector3f VVar12;
  Event event;
  Event local_3c;
  
  pSVar8 = SensorManager::getInstance();
  SensorManager::update(pSVar8);
  pfVar9 = &this->m_sensorValue[0].z;
  lVar10 = 0;
  do {
    pSVar8 = SensorManager::getInstance();
    sensor_00 = (Type)lVar10;
    bVar7 = SensorManager::isEnabled(pSVar8,sensor_00);
    if (bVar7) {
      fVar2 = ((Vector3f *)(pfVar9 + -2))->x;
      fVar3 = pfVar9[-1];
      fVar4 = *pfVar9;
      pSVar8 = SensorManager::getInstance();
      VVar12 = SensorManager::getValue(pSVar8,sensor_00);
      fVar11 = VVar12.z;
      ((Vector3f *)(pfVar9 + -2))->x = (float)(int)VVar12._0_8_;
      ((Vector3f *)(pfVar9 + -2))->y = (float)(int)((ulong)VVar12._0_8_ >> 0x20);
      *pfVar9 = fVar11;
      fVar5 = ((Vector3f *)(pfVar9 + -2))->x;
      if ((fVar5 == fVar2) && (!NAN(fVar5) && !NAN(fVar2))) {
        if ((pfVar9[-1] == fVar3) && (!NAN(pfVar9[-1]) && !NAN(fVar3))) {
          if ((fVar11 == fVar4) && (!NAN(fVar11) && !NAN(fVar4))) goto LAB_001dd821;
        }
      }
      local_3c.type = SensorChanged;
      local_3c.field_1.mouseButton.y = (int)pfVar9[-1];
      pEVar6 = (this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      local_3c.field_1.sensor.type = sensor_00;
      local_3c.field_1.mouseWheelScroll.delta = fVar5;
      local_3c.field_1.sensor.z = fVar11;
      if (pEVar6 == (this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<sf::Event,std::allocator<sf::Event>>::_M_push_back_aux<sf::Event_const&>
                  ((deque<sf::Event,std::allocator<sf::Event>> *)&this->m_events,&local_3c);
      }
      else {
        (pEVar6->field_1).sensor.z = fVar11;
        *(ulong *)pEVar6 = CONCAT44(sensor_00,0x16);
        *(ulong *)((long)&pEVar6->field_1 + 4) = CONCAT44(local_3c.field_1.mouseButton.y,fVar5);
        piVar1 = &(this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>.
                  _M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
    }
LAB_001dd821:
    lVar10 = lVar10 + 1;
    pfVar9 = pfVar9 + 3;
    if (lVar10 == 6) {
      return;
    }
  } while( true );
}

Assistant:

void WindowImpl::processSensorEvents()
{
    // First update the sensor states
    SensorManager::getInstance().update();

    for (unsigned int i = 0; i < Sensor::Count; ++i)
    {
        Sensor::Type sensor = static_cast<Sensor::Type>(i);

        // Only process enabled sensors
        if (SensorManager::getInstance().isEnabled(sensor))
        {
            // Copy the previous value of the sensor and get the new one
            Vector3f previousValue = m_sensorValue[i];
            m_sensorValue[i] = SensorManager::getInstance().getValue(sensor);

            // If the value has changed, trigger an event
            if (m_sensorValue[i] != previousValue) // @todo use a threshold?
            {
                Event event;
                event.type = Event::SensorChanged;
                event.sensor.type = sensor;
                event.sensor.x = m_sensorValue[i].x;
                event.sensor.y = m_sensorValue[i].y;
                event.sensor.z = m_sensorValue[i].z;
                pushEvent(event);
            }
        }
    }
}